

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bool __thiscall slang::ast::Type::isDerivedFrom(Type *this,Type *base)

{
  bool bVar1;
  Type *pTVar2;
  Type *this_00;
  Type *pTVar3;
  
  pTVar2 = getCanonicalType(this);
  this_00 = getCanonicalType(base);
  pTVar3 = getCanonicalType(this_00);
  if ((pTVar3->super_Symbol).kind == ClassType) {
    do {
      if (pTVar2 == (Type *)0x0) goto LAB_0025bff8;
      pTVar3 = getCanonicalType(pTVar2);
      if ((pTVar3->super_Symbol).kind != ClassType) {
        pTVar2 = getCanonicalType(pTVar2);
        if ((pTVar2->super_Symbol).kind == ErrorType) {
          return true;
        }
        goto LAB_0025bff8;
      }
      if (*(int *)&pTVar2[1].super_Symbol.nextInScope != 0) {
        Scope::elaborate((Scope *)(pTVar2 + 1));
      }
      pTVar2 = (Type *)pTVar2[2].super_Symbol.name._M_len;
    } while (pTVar2 != this_00);
    bVar1 = true;
  }
  else {
LAB_0025bff8:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Type::isDerivedFrom(const Type& base) const {
    const Type* d = &getCanonicalType();
    const Type* b = &base.getCanonicalType();
    if (!b->isClass())
        return false;

    while (d && d->isClass()) {
        d = d->as<ClassType>().getBaseClass();
        if (d == b)
            return true;
    }

    // Allow error types to be convertible / derivable from anything else,
    // to prevent knock-on errors from being reported.
    if (d && d->isError())
        return true;

    return false;
}